

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_xload(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  AliasRet AVar3;
  TRef TVar4;
  long in_RDI;
  IRIns *unaff_retaddr;
  jit_State *in_stack_00000008;
  IRType st;
  IRType dt;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRIns *xr;
  IRRef xref;
  ushort local_38;
  jit_State *in_stack_ffffffffffffffd0;
  uint local_28;
  uint local_24;
  uint local_14;
  
  local_24 = (uint)*(ushort *)(in_RDI + 0x98);
  local_14 = local_24;
  if ((*(ushort *)(in_RDI + 0x9a) & 1) != 0) goto LAB_0014494c;
  if ((*(ushort *)(in_RDI + 0x9a) & 2) != 0) {
LAB_00144a7d:
    TVar4 = lj_ir_emit(in_stack_ffffffffffffffd0);
    return TVar4;
  }
  local_28 = (uint)*(ushort *)(in_RDI + 0x1d6);
  do {
    local_24 = local_14;
    if (local_14 < *(ushort *)(in_RDI + 0x1f8)) {
      local_24 = (uint)*(ushort *)(in_RDI + 0x1f8);
    }
    if (local_24 < *(ushort *)(in_RDI + 0x1e8)) {
      local_24 = (uint)*(ushort *)(in_RDI + 0x1e8);
    }
    while (local_24 < local_28) {
      in_stack_ffffffffffffffd0 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_28 * 8);
      AVar3 = aa_xref((jit_State *)&xr->field_0,_ref,store,_st);
      if (AVar3 != ALIAS_NO) {
        if (AVar3 == ALIAS_MAY) {
          local_24 = local_28;
          break;
        }
        if (AVar3 == ALIAS_MUST) {
          if (((*(byte *)(in_RDI + 0x9c) ^
               *(byte *)(*(long *)(in_RDI + 0x10) + 4 +
                        (ulong)*(ushort *)
                                ((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2) * 8)) &
              0x1f) != 0) {
            uVar2 = *(byte *)(in_RDI + 0x9c) & 0x1f;
            if ((uVar2 == 0xf) || (uVar2 == 0x11)) {
              local_38 = uVar2 | 0x800;
              uVar1 = 0x13;
            }
            else if ((uVar2 == 0x10) ||
                    (local_38 = *(byte *)(*(long *)(in_RDI + 0x10) + 4 +
                                         (ulong)*(ushort *)
                                                 ((long)&(in_stack_ffffffffffffffd0->cur).nextgc.
                                                         gcptr32 + 2) * 8) & 0x1f, uVar1 = uVar2,
                    uVar2 == 0x12)) {
              uVar1 = 0x13;
              local_38 = uVar2;
            }
            *(ushort *)(in_RDI + 0x9c) = uVar1 | 0x5500;
            *(undefined2 *)(in_RDI + 0x98) =
                 *(undefined2 *)((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2);
            *(ushort *)(in_RDI + 0x9a) = uVar1 << 5 | local_38;
            return 1;
          }
          return (uint)*(ushort *)((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2);
        }
      }
      uVar2._0_1_ = (in_stack_ffffffffffffffd0->cur).topslot;
      uVar2._1_1_ = (in_stack_ffffffffffffffd0->cur).linktype;
      local_28 = (uint)uVar2;
    }
LAB_0014494c:
    uVar2 = *(ushort *)(in_RDI + 0x1c8);
    while (local_28 = (uint)uVar2, local_24 < local_28) {
      if ((*(ushort *)(*(long *)(in_RDI + 0x10) + (ulong)local_28 * 8) == local_14) &&
         (((*(byte *)(*(long *)(in_RDI + 0x10) + 4 + (ulong)local_28 * 8) ^ *(byte *)(in_RDI + 0x9c)
           ) & 0x1f) == 0)) {
        return local_28;
      }
      uVar2 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)local_28 * 8);
    }
    if (((((*(ushort *)(in_RDI + 0x9a) & 1) != 0) || (*(short *)(in_RDI + 0x162) == 0)) ||
        (local_14 != *(ushort *)(in_RDI + 0x98))) ||
       (local_14 = reassoc_xref(in_stack_00000008,unaff_retaddr), local_14 == 0)) goto LAB_00144a7d;
    uVar2 = *(ushort *)(in_RDI + 0x1d6);
    while (local_28 = (uint)uVar2, local_24 < local_28) {
      uVar2 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)local_28 * 8);
    }
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_xload(jit_State *J)
{
  IRRef xref = fins->op1;
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  if ((fins->op2 & IRXLOAD_READONLY))
    goto cselim;
  if ((fins->op2 & IRXLOAD_VOLATILE))
    goto doemit;

  /* Search for conflicting stores. */
  ref = J->chain[IR_XSTORE];
retry:
  if (J->chain[IR_CALLXS] > lim) lim = J->chain[IR_CALLXS];
  if (J->chain[IR_XBAR] > lim) lim = J->chain[IR_XBAR];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_xref(J, xr, fins, store)) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST:
      /* Emit conversion if the loaded type doesn't match the forwarded type. */
      if (!irt_sametype(fins->t, IR(store->op2)->t)) {
	IRType dt = irt_type(fins->t), st = irt_type(IR(store->op2)->t);
	if (dt == IRT_I8 || dt == IRT_I16) {  /* Trunc + sign-extend. */
	  st = dt | IRCONV_SEXT;
	  dt = IRT_INT;
	} else if (dt == IRT_U8 || dt == IRT_U16) {  /* Trunc + zero-extend. */
	  st = dt;
	  dt = IRT_INT;
	}
	fins->ot = IRT(IR_CONV, dt);
	fins->op1 = store->op2;
	fins->op2 = (dt<<5)|st;
	return RETRYFOLD;
      }
      return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_XLOAD];
  while (ref > lim) {
    /* CSE for XLOAD depends on the type, but not on the IRXLOAD_* flags. */
    if (IR(ref)->op1 == xref && irt_sametype(IR(ref)->t, fins->t))
      return ref;
    ref = IR(ref)->prev;
  }

  /* Reassociate XLOAD across PHIs to handle a[i-1] forwarding case. */
  if (!(fins->op2 & IRXLOAD_READONLY) && J->chain[IR_LOOP] &&
      xref == fins->op1 && (xref = reassoc_xref(J, xr)) != 0) {
    ref = J->chain[IR_XSTORE];
    while (ref > lim)  /* Skip stores that have already been checked. */
      ref = IR(ref)->prev;
    lim = xref;
    xr = IR(xref);
    goto retry;  /* Retry with the reassociated reference. */
  }
doemit:
  return EMITFOLD;
}